

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  undefined1 uVar1;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other;
  Nonnull<const_char_*> pcVar2;
  long lVar3;
  
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (this,other_mutator,"this == other_mutator");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    this_00 = (RepeatedPtrFieldBase *)(**(code **)((long)*this + 0x88))(this,data);
    other = (RepeatedPtrFieldBase *)(**(code **)((long)*this + 0x88))(this,other_data);
    if (this_00 != other) {
      if (this_00->arena_ != other->arena_) {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (this_00,other);
        return;
      }
      lVar3 = 0;
      do {
        uVar1 = *(undefined1 *)((long)&this_00->tagged_rep_or_elem_ + lVar3);
        *(undefined1 *)((long)&this_00->tagged_rep_or_elem_ + lVar3) =
             *(undefined1 *)((long)&other->tagged_rep_or_elem_ + lVar3);
        *(undefined1 *)((long)&other->tagged_rep_or_elem_ + lVar3) = uVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
    }
    return;
  }
  Swap();
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    ABSL_CHECK_EQ(this, other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }